

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

RowSetEntry * rowSetListToTree(RowSetEntry *pList)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  int iDepth;
  RowSetEntry *local_20;
  
  pRVar2 = pList->pRight;
  pList->pRight = (RowSetEntry *)0x0;
  pList->pLeft = (RowSetEntry *)0x0;
  iDepth = 1;
  while (pRVar2 != (RowSetEntry *)0x0) {
    local_20 = pRVar2->pRight;
    pRVar2->pLeft = pList;
    pRVar1 = rowSetNDeepTree(&local_20,iDepth);
    pRVar2->pRight = pRVar1;
    iDepth = iDepth + 1;
    pList = pRVar2;
    pRVar2 = local_20;
  }
  return pList;
}

Assistant:

static struct RowSetEntry *rowSetListToTree(struct RowSetEntry *pList){
  int iDepth;           /* Depth of the tree so far */
  struct RowSetEntry *p;       /* Current tree root */
  struct RowSetEntry *pLeft;   /* Left subtree */

  assert( pList!=0 );
  p = pList;
  pList = p->pRight;
  p->pLeft = p->pRight = 0;
  for(iDepth=1; pList; iDepth++){
    pLeft = p;
    p = pList;
    pList = p->pRight;
    p->pLeft = pLeft;
    p->pRight = rowSetNDeepTree(&pList, iDepth);
  }
  return p;
}